

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatActivity.c
# Opt level: O1

void Msat_SolverVarBumpActivity(Msat_Solver_t *p,Msat_Lit_t Lit)

{
  int iVar1;
  double *pdVar2;
  long lVar3;
  int Var;
  double dVar4;
  
  if (p->dVarDecay <= 0.0 && p->dVarDecay != 0.0) {
    return;
  }
  Var = Lit >> 1;
  pdVar2 = p->pdActivity;
  dVar4 = p->dVarInc + pdVar2[Var];
  pdVar2[Var] = dVar4;
  if (1e+100 < dVar4) {
    iVar1 = p->nVars;
    if (0 < (long)iVar1) {
      lVar3 = 0;
      do {
        pdVar2[lVar3] = pdVar2[lVar3] * 1e-100;
        lVar3 = lVar3 + 1;
      } while (iVar1 != lVar3);
    }
    p->dVarInc = p->dVarInc * 1e-100;
  }
  Msat_OrderUpdate(p->pOrder,Var);
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Msat_SolverVarBumpActivity( Msat_Solver_t * p, Msat_Lit_t Lit )
{
    Msat_Var_t Var;
    if ( p->dVarDecay < 0 ) // (negative decay means static variable order -- don't bump)
        return;
    Var = MSAT_LIT2VAR(Lit);
    p->pdActivity[Var] += p->dVarInc;
//    p->pdActivity[Var] += p->dVarInc * p->pFactors[Var];
    if ( p->pdActivity[Var] > 1e100 )
        Msat_SolverVarRescaleActivity( p );
    Msat_OrderUpdate( p->pOrder, Var );
}